

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddCount.c
# Opt level: O0

int Cudd_zddCount(DdManager *zdd,DdNode *P)

{
  DdNode *base_00;
  DdNode *empty_00;
  st__table *table_00;
  DdNode *empty;
  DdNode *base;
  int res;
  st__table *table;
  DdNode *P_local;
  DdManager *zdd_local;
  
  base_00 = zdd->one;
  empty_00 = zdd->zero;
  table_00 = st__init_table(st__ptrcmp,st__ptrhash);
  if (table_00 == (st__table *)0x0) {
    zdd_local._4_4_ = -1;
  }
  else {
    zdd_local._4_4_ = cuddZddCountStep(P,table_00,base_00,empty_00);
    if (zdd_local._4_4_ == -1) {
      zdd->errorCode = CUDD_MEMORY_OUT;
    }
    st__foreach(table_00,st__zdd_countfree,(char *)0x0);
    st__free_table(table_00);
  }
  return zdd_local._4_4_;
}

Assistant:

int
Cudd_zddCount(
  DdManager * zdd,
  DdNode * P)
{
    st__table    *table;
    int         res;
    DdNode      *base, *empty;

    base  = DD_ONE(zdd);
    empty = DD_ZERO(zdd);
    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) return(CUDD_OUT_OF_MEM);
    res = cuddZddCountStep(P, table, base, empty);
    if (res == CUDD_OUT_OF_MEM) {
        zdd->errorCode = CUDD_MEMORY_OUT;
    }
    st__foreach(table, st__zdd_countfree, NIL(char));
    st__free_table(table);

    return(res);

}